

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  byte bVar1;
  Rtree *pRtree;
  int iVar2;
  RtreeNode *pNode;
  sqlite3_value *pValue;
  i64 iVar3;
  sqlite3_vtab *psVar4;
  int iVar5;
  sqlite3_vtab *pStmt;
  RtreeCoord c;
  sqlite3_vtab_cursor *local_48;
  sqlite3_context *local_40;
  int local_34;
  
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar4 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar4 = cur[6].pVtab;
    }
  }
  else {
    psVar4 = (sqlite3_vtab *)(cur + 8);
  }
  pRtree = (Rtree *)cur->pVtab;
  local_34 = 0;
  local_40 = ctx;
  pNode = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,&local_34);
  iVar2 = local_34;
  if (local_34 == 0) {
    iVar5 = 0;
    iVar2 = 0;
    if (psVar4 != (sqlite3_vtab *)0x0) {
      iVar2 = iVar5;
      if (i == 0) {
        iVar3 = nodeGetRowid(pRtree,pNode,(uint)*(byte *)((long)&psVar4->zErrMsg + 2));
        sqlite3_result_int64(local_40,iVar3);
      }
      else {
        bVar1 = pRtree->nDim2;
        if ((int)(uint)bVar1 < i) {
          if (*(char *)((long)&cur[1].pVtab + 2) == '\0') {
            local_48 = cur + 7;
            pStmt = cur[7].pVtab;
            if (pStmt == (sqlite3_vtab *)0x0) {
              iVar2 = sqlite3_prepare_v3(pRtree->db,pRtree->zReadAuxSql,-1,0,
                                         (sqlite3_stmt **)local_48,(char **)0x0);
              if (iVar2 != 0) {
                return iVar2;
              }
              pStmt = local_48->pVtab;
            }
            iVar3 = nodeGetRowid(pRtree,pNode,(uint)*(byte *)((long)&psVar4->zErrMsg + 2));
            sqlite3_bind_int64((sqlite3_stmt *)pStmt,1,iVar3);
            iVar2 = sqlite3_step((sqlite3_stmt *)local_48->pVtab);
            if (iVar2 != 100) {
              sqlite3_reset((sqlite3_stmt *)local_48->pVtab);
              if (iVar2 == 0x65) {
                return 0;
              }
              return iVar2;
            }
            *(undefined1 *)((long)&cur[1].pVtab + 2) = 1;
            bVar1 = pRtree->nDim2;
          }
          pValue = sqlite3_column_value((sqlite3_stmt *)cur[7].pVtab,(i - (uint)bVar1) + 1);
          sqlite3_result_value(local_40,pValue);
          iVar2 = 0;
        }
        else {
          readCoord(pNode->zData +
                    (int)((uint)pRtree->nBytesPerCell * (uint)*(byte *)((long)&psVar4->zErrMsg + 2)
                          + i * 4 + 8),&c);
          if (pRtree->eCoordType == '\0') {
            sqlite3_result_double(local_40,(double)c.f);
          }
          else {
            sqlite3_result_int(local_40,c.i);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( p==0 ) return SQLITE_OK;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else if( i<=pRtree->nDim2 ){
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }else{
    if( !pCsr->bAuxValid ){
      if( pCsr->pReadAux==0 ){
        rc = sqlite3_prepare_v3(pRtree->db, pRtree->zReadAuxSql, -1, 0,
                                &pCsr->pReadAux, 0);
        if( rc ) return rc;
      }
      sqlite3_bind_int64(pCsr->pReadAux, 1, 
          nodeGetRowid(pRtree, pNode, p->iCell));
      rc = sqlite3_step(pCsr->pReadAux);
      if( rc==SQLITE_ROW ){
        pCsr->bAuxValid = 1;
      }else{
        sqlite3_reset(pCsr->pReadAux);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        return rc;
      }
    }
    sqlite3_result_value(ctx,
         sqlite3_column_value(pCsr->pReadAux, i - pRtree->nDim2 + 1));
  }  
  return SQLITE_OK;
}